

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O1

void __thiscall
HdlcAnalyzer::ProcessInformationField
          (HdlcAnalyzer *this,vector<HdlcByte,_std::allocator<HdlcByte>_> *information)

{
  byte bVar1;
  bool bVar2;
  pointer pHVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  Frame frame;
  U64 local_70;
  U64 UStack_68;
  ulong local_60;
  ulong local_58;
  undefined1 local_50;
  byte local_4f;
  U64 local_48;
  U64 UStack_40;
  
  pHVar3 = (information->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((information->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
      super__Vector_impl_data._M_finish != pHVar3) {
    uVar5 = 1;
    uVar6 = 0;
    do {
      local_48 = pHVar3[uVar6].startSample;
      UStack_40 = pHVar3[uVar6].endSample;
      bVar1 = pHVar3[uVar6].value;
      bVar2 = pHVar3[uVar6].escaped;
      Frame::Frame((Frame *)&local_70);
      local_70 = local_48;
      UStack_68 = UStack_40;
      local_50 = 5;
      local_60 = (ulong)bVar1;
      local_58 = uVar6;
      local_4f = bVar2 & 1;
      std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,(Frame *)&local_70)
      ;
      Frame::~Frame((Frame *)&local_70);
      uVar6 = (ulong)uVar5;
      pHVar3 = (information->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(information->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pHVar3 >> 3) * -0x5555555555555555;
      uVar5 = uVar5 + 1;
    } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
  }
  return;
}

Assistant:

void HdlcAnalyzer::ProcessInformationField( const vector<HdlcByte>& information )
{
    for( U32 i = 0; i < information.size(); ++i )
    {
        HdlcByte byte = information.at( i );
        U8 flag = ( byte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
        Frame frame = CreateFrame( HDLC_FIELD_INFORMATION, byte.startSample, byte.endSample, byte.value, i, flag );
        AddFrameToResults( frame );
    }
}